

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O2

void __thiscall Lowerer::LowerNewConcatStrMultiBE(Lowerer *this,Instr *instr)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  code *pcVar1;
  bool bVar2;
  uint32 offset;
  undefined4 *puVar3;
  RegOpnd *baseOpnd;
  IntConstOpnd *this_01;
  StackSym *pSVar4;
  Instr *pIVar5;
  IndirOpnd *dstOpnd;
  Instr *pIVar6;
  Opnd *pOVar7;
  Opnd *local_48;
  
  bVar2 = IR::Opnd::IsConstOpnd(instr->m_src1);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65dd,"(instr->GetSrc1()->IsConstOpnd())","instr->GetSrc1()->IsConstOpnd()"
                      );
    if (!bVar2) goto LAB_005610a0;
    *puVar3 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(instr->m_dst);
  if (bVar2) {
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x65de,"(instr->GetDst()->IsRegOpnd())","instr->GetDst()->IsRegOpnd()");
    if (!bVar2) goto LAB_005610a0;
    *puVar3 = 0;
  }
  baseOpnd = IR::Opnd::AsRegOpnd(instr->m_dst);
  this_01 = IR::Opnd::AsIntConstOpnd(instr->m_src1);
  offset = IR::IntConstOpnd::AsUint32(this_01);
  local_48 = (Opnd *)0x0;
  pIVar6 = instr;
  while( true ) {
    offset = offset - 1;
    pOVar7 = pIVar6->m_src2;
    if (pOVar7 == (Opnd *)0x0) break;
    bVar2 = IR::Opnd::IsRegOpnd(pOVar7);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x65e8,"(linkOpnd->IsRegOpnd())","linkOpnd->IsRegOpnd()");
      if (!bVar2) goto LAB_005610a0;
      *puVar3 = 0;
    }
    pSVar4 = IR::Opnd::GetStackSym(pOVar7);
    pIVar6 = (pSVar4->field_5).m_instrDef;
    pIVar5 = (Instr *)0x0;
    if ((pSVar4->field_0x18 & 1) != 0) {
      pIVar5 = pIVar6;
    }
    if (pIVar5->m_opcode != SetConcatStrMultiItemBE) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x65ea,
                         "(concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE)",
                         "concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE");
      if (!bVar2) goto LAB_005610a0;
      *puVar3 = 0;
    }
    pOVar7 = pIVar5->m_src1;
    bVar2 = IR::Opnd::IsRegOpnd(pOVar7);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                         ,0x65ed,"(concatItemOpnd->IsRegOpnd())","concatItemOpnd->IsRegOpnd()");
      if (!bVar2) goto LAB_005610a0;
      *puVar3 = 0;
    }
    bVar2 = IR::Opnd::IsEqual(pOVar7,&baseOpnd->super_Opnd);
    if (bVar2) {
      pOVar7 = local_48;
      if (local_48 == (Opnd *)0x0) {
        pIVar5 = IR::Instr::HoistSrc1(pIVar5,Ld_A,RegNOREG,(StackSym *)0x0);
        pOVar7 = pIVar5->m_dst;
        local_48 = pOVar7;
      }
    }
    else {
      this_00 = this->addToLiveOnBackEdgeSyms;
      pSVar4 = IR::Opnd::GetStackSym(pOVar7);
      BVSparse<Memory::JitArenaAllocator>::Set(this_00,(pSVar4->super_Sym).m_id);
    }
    dstOpnd = IR::IndirOpnd::New(baseOpnd,offset,TyVar,instr->m_func,false);
    pIVar5 = IR::Instr::New(SetConcatStrMultiItem,&dstOpnd->super_Opnd,pOVar7,instr->m_func);
    IR::Instr::InsertAfter(instr,pIVar5);
    LowerSetConcatStrMultiItem(this,pIVar5);
  }
  if (offset != 0xffffffff) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x6610,"(index == -1)","index == -1");
    if (!bVar2) {
LAB_005610a0:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  LowerNewConcatStrMulti(this,instr);
  return;
}

Assistant:

void
Lowerer::LowerNewConcatStrMultiBE(IR::Instr * instr)
{
    // Lower
    // t1 = SetConcatStrMultiBE s1
    // t2 = SetConcatStrMultiBE s2, t1
    // t3 = SetConcatStrMultiBE s3, t2
    // s  = NewConcatStrMultiBE 3, t3
    //            to
    // s   = new concat string
    // s+0 = s1
    // s+1 = s2
    // s+2 = s3
    Assert(instr->GetSrc1()->IsConstOpnd());
    Assert(instr->GetDst()->IsRegOpnd());

    IR::RegOpnd * newString = instr->GetDst()->AsRegOpnd();

    IR::Opnd * newConcatItemOpnd = nullptr;
    uint index = instr->GetSrc1()->AsIntConstOpnd()->AsUint32() - 1;
    IR::Instr * concatItemInstr = nullptr;
    IR::Opnd * linkOpnd = instr->GetSrc2();
    while (linkOpnd)
    {
        Assert(linkOpnd->IsRegOpnd());
        concatItemInstr = linkOpnd->GetStackSym()->GetInstrDef();
        Assert(concatItemInstr->m_opcode == Js::OpCode::SetConcatStrMultiItemBE);

        IR::Opnd * concatItemOpnd = concatItemInstr->GetSrc1();
        Assert(concatItemOpnd->IsRegOpnd());

        // If one of the concat items is equal to the dst of the concat expressions (s = s + a + b),
        // hoist the load of that item to before the setting of the new string to the dst.
        if (concatItemOpnd->IsEqual(newString))
        {
            if (!newConcatItemOpnd)
            {
                IR::Instr * hoistSrcInstr = concatItemInstr->HoistSrc1(Js::OpCode::Ld_A);
                newConcatItemOpnd = hoistSrcInstr->GetDst();
            }
            concatItemOpnd = newConcatItemOpnd;
        }
        else
        {
            // If only some of the SetConcatStrMultiItemBE instructions were CSE'd and the rest, along with the NewConcatStrMultiBE
            // instruction, were in a loop, the strings on the CSE'd Set*BE instructions will become live on back edge. Add them to
            // addToLiveOnBackEdgeSyms here and clear when we reach the Set*BE instruction.

            // Note that we are doing this only for string opnds which are not the same as the dst of the concat expression. Reasoning
            // behind this is that if a loop has a concat expression with one of its sources same as the dst, the Set*BE instruction
            // for the dst wouldn't have been CSE'd as the dst's value is changing in the loop and the backward pass should have set the
            // symbol as live on backedge.
            this->addToLiveOnBackEdgeSyms->Set(concatItemOpnd->GetStackSym()->m_id);
        }
        IR::Instr * newConcatItemInstr = IR::Instr::New(Js::OpCode::SetConcatStrMultiItem,
                                                        IR::IndirOpnd::New(newString, index, TyVar, instr->m_func),
                                                        concatItemOpnd,
                                                        instr->m_func);
        instr->InsertAfter(newConcatItemInstr);
        this->LowerSetConcatStrMultiItem(newConcatItemInstr);

        linkOpnd = concatItemInstr->GetSrc2();
        index--;
    }
    Assert(index == -1);
    this->LowerNewConcatStrMulti(instr);
}